

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O2

void __thiscall xmrig::SelfSelectClient::getBlockTemplate(SelfSelectClient *this)

{
  long id;
  int __flags;
  Value params;
  String local_a0;
  StringRefType local_90;
  StringRefType local_80;
  Document doc;
  
  setState(this,WaitState);
  __flags = 0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,kObjectType,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  params.data_.n = (Number)0x0;
  params.data_.s.str = (Ch *)0x3000000000000;
  local_80.s = "wallet_address";
  local_80.length = 0xe;
  String::toJSON(&local_a0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_80,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a0,doc.allocator_);
  local_90.s = "extra_nonce";
  local_90.length = 0xb;
  String::toJSON(&local_a0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_90,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a0,doc.allocator_);
  id = this->m_sequence;
  this->m_sequence = id + 1;
  JsonRequest::create(&doc,id,"getblocktemplate",&params);
  send(this,3,"/json_rpc",(size_t)&doc,__flags);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&doc);
  return;
}

Assistant:

void xmrig::SelfSelectClient::getBlockTemplate()
{
    setState(WaitState);

    using namespace rapidjson;
    Document doc(kObjectType);
    auto &allocator = doc.GetAllocator();

    Value params(kObjectType);
    params.AddMember("wallet_address",  m_job.poolWallet().toJSON(), allocator);
    params.AddMember("extra_nonce",     m_job.extraNonce().toJSON(), allocator);

    JsonRequest::create(doc, m_sequence++, "getblocktemplate", params);

    send(HTTP_POST, "/json_rpc", doc);
}